

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_icu::install_parsing_facets<char>(locale *in,cdata *cd)

{
  bool bVar1;
  icu_formatters_cache *__f;
  cdata *in_RSI;
  _Impl *in_RDI;
  locale *tmp;
  Locale *in_stack_00000148;
  icu_formatters_cache *in_stack_00000150;
  _Impl *refs;
  locale in_stack_ffffffffffffffc8;
  locale *in_stack_ffffffffffffffd0;
  
  refs = in_RDI;
  __f = (icu_formatters_cache *)operator_new(0x110);
  num_parse<char>::num_parse((num_parse<char> *)__f,in_RSI,(size_t)refs);
  std::locale::locale<booster::locale::impl_icu::num_parse<char>>
            (in_stack_ffffffffffffffd0,(locale *)in_stack_ffffffffffffffc8._M_impl,
             (num_parse<char> *)__f);
  bVar1 = std::has_facet<booster::locale::impl_icu::icu_formatters_cache>((locale *)__f);
  if (!bVar1) {
    operator_new(0x730);
    icu_formatters_cache::icu_formatters_cache(in_stack_00000150,in_stack_00000148);
    std::locale::locale<booster::locale::impl_icu::icu_formatters_cache>
              (in_stack_ffffffffffffffd0,(locale *)in_stack_ffffffffffffffc8._M_impl,__f);
    std::locale::operator=((locale *)in_RDI,(locale *)&stack0xffffffffffffffc8);
    std::locale::~locale((locale *)&stack0xffffffffffffffc8);
  }
  return (locale)refs;
}

Assistant:

std::locale install_parsing_facets(std::locale const &in,cdata const &cd)
{
    std::locale tmp=std::locale(in,new num_parse<CharType>(cd));
    if(!std::has_facet<icu_formatters_cache>(in)) {
        tmp=std::locale(tmp,new icu_formatters_cache(cd.locale)); 
    }
    return tmp;
}